

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O2

Vec_Int_t *
Gia_PolynFindOrder(Gia_Man_t *pGia,Vec_Int_t *vFadds,Vec_Int_t *vHadds,int fVerbose,int fVeryVerbose
                  )

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int i;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Vec_Int_t *p;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int i_00;
  int iVar16;
  int iVar17;
  int iVar18;
  
  p = Vec_IntAlloc(100);
  pVVar10 = Vec_IntStart(pGia->nObjs);
  for (iVar15 = 0; iVar15 < pGia->vCos->nSize; iVar15 = iVar15 + 1) {
    iVar4 = Vec_IntEntry(pGia->vCos,iVar15);
    pGVar11 = Gia_ManObj(pGia,iVar4);
    iVar4 = Gia_ObjId(pGia,pGVar11);
    Vec_IntWriteEntry(pVVar10,iVar4 - (*(uint *)pGVar11 & 0x1fffffff),1);
  }
  pVVar12 = pGia->vXors;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
      pGia->vXors->pArray = (int *)0x0;
      pVVar12 = pGia->vXors;
      if (pVVar12 == (Vec_Int_t *)0x0) goto LAB_0053e34d;
    }
    free(pVVar12);
    pGia->vXors = (Vec_Int_t *)0x0;
  }
LAB_0053e34d:
  pVVar12 = Gia_PolynCollectLastXor(pGia,fVerbose);
  pGia->vXors = pVVar12;
  printf("Collected %d topmost XORs\n",(ulong)(uint)pVVar12->nSize);
  for (iVar15 = 0; iVar15 < pGia->vXors->nSize; iVar15 = iVar15 + 1) {
    uVar5 = Vec_IntEntry(pGia->vXors,iVar15);
    pGVar11 = Gia_ManObj(pGia,uVar5);
    iVar4 = Vec_IntEntry(pVVar10,uVar5);
    if (iVar4 == 0) {
      __assert_fail("Vec_IntEntry(vMap, iAnd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecOrder.c"
                    ,0x3e,
                    "Vec_Int_t *Gia_PolynFindOrder(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    Vec_IntWriteEntry(pVVar10,uVar5,0);
    Vec_IntWriteEntry(pVVar10,uVar5 - (*(uint *)pGVar11 & 0x1fffffff),1);
    Vec_IntWriteEntry(pVVar10,uVar5 - (*(uint *)&pGVar11->field_0x4 & 0x1fffffff),1);
    Vec_IntPush(p,uVar5 * 4 + 3);
    if (fVeryVerbose != 0) {
      printf("Recognizing %d => XXXOR(%d %d)\n",(ulong)uVar5,
             (ulong)(uVar5 - ((uint)*(undefined8 *)pGVar11 & 0x1fffffff)),
             (ulong)(uVar5 - ((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) & 0x1fffffff)));
    }
  }
  bVar2 = true;
  uVar13 = 0;
LAB_0053e462:
  if (!bVar2) {
    pVVar12 = Vec_IntAlloc(100);
    iVar15 = pVVar10->nSize;
    iVar4 = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
      iVar4 = 0;
    }
    for (; iVar15 != iVar4; iVar4 = iVar4 + 1) {
      iVar17 = Vec_IntEntry(pVVar10,iVar4);
      if ((iVar17 != 0) &&
         (pGVar11 = Gia_ManObj(pGia,iVar4),
         (~*(uint *)pGVar11 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar11)) {
        Vec_IntPush(pVVar12,iVar4);
      }
    }
    Vec_IntFree(pVVar10);
    pVVar10 = Vec_IntAlloc(100);
    Gia_ManIncrementTravId(pGia);
    Gia_ManCollectAnds(pGia,pVVar12->pArray,pVVar12->nSize,pVVar10,(Vec_Int_t *)0x0);
    for (iVar15 = 0; iVar15 < pVVar10->nSize; iVar15 = iVar15 + 1) {
      iVar4 = Vec_IntEntry(pVVar10,iVar15);
      Vec_IntWriteEntry(pVVar10,iVar15,iVar4 * 4);
    }
    Vec_IntFree(pVVar12);
    iVar15 = p->nSize;
    uVar13 = (long)iVar15 / 2 & 0xffffffff;
    uVar14 = 0;
    iVar4 = iVar15;
    if ((int)((long)iVar15 / 2) < 1) {
      uVar13 = 0;
    }
    for (; iVar4 = iVar4 + -1, uVar13 != uVar14; uVar14 = uVar14 + 1) {
      piVar1 = p->pArray;
      iVar17 = piVar1[uVar14];
      piVar1[uVar14] = piVar1[iVar4];
      piVar1[iVar4] = iVar17;
    }
    iVar4 = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
      iVar4 = 0;
    }
    for (; iVar15 != iVar4; iVar4 = iVar4 + 1) {
      iVar17 = Vec_IntEntry(p,iVar4);
      Vec_IntPush(pVVar10,iVar17);
    }
    Vec_IntFree(p);
    return pVVar10;
  }
  if (fVeryVerbose != 0) {
    printf("Iteration %d\n",uVar13);
  }
  bVar2 = false;
LAB_0053e490:
  uVar14 = (long)vFadds->nSize / 5 & 0xffffffff;
  bVar3 = true;
  do {
    iVar15 = (int)uVar14;
    iVar4 = iVar15 * 4;
    iVar17 = iVar15 * 5 + -1;
    iVar18 = 0;
    while( true ) {
      iVar16 = (int)uVar14;
      if (iVar16 < 1) {
        if (!bVar3) goto LAB_0053e490;
        uVar14 = (long)vHadds->nSize / 2 & 0xffffffff;
        goto LAB_0053e663;
      }
      uVar5 = Vec_IntEntry(vFadds,iVar18 + iVar17 + -1);
      i = Vec_IntEntry(vFadds,iVar18 + iVar17);
      iVar6 = Vec_IntEntry(pVVar10,uVar5);
      if ((iVar6 != 0) && (iVar6 = Vec_IntEntry(pVVar10,i), iVar6 != 0)) break;
      iVar4 = iVar4 + -4;
      iVar18 = iVar18 + -5;
      uVar14 = (ulong)(iVar16 - 1);
    }
    bVar3 = false;
    Vec_IntWriteEntry(pVVar10,uVar5,0);
    Vec_IntWriteEntry(pVVar10,i,0);
    iVar15 = iVar15 * 5;
    iVar6 = iVar18 + iVar15 + -5;
    iVar17 = Vec_IntEntry(vFadds,iVar6);
    Vec_IntWriteEntry(pVVar10,iVar17,1);
    i_00 = iVar18 + iVar15 + -4;
    iVar17 = Vec_IntEntry(vFadds,i_00);
    Vec_IntWriteEntry(pVVar10,iVar17,1);
    iVar17 = iVar18 + iVar15 + -3;
    iVar15 = Vec_IntEntry(vFadds,iVar17);
    bVar2 = true;
    Vec_IntWriteEntry(pVVar10,iVar15,1);
    Vec_IntPush(p,iVar4 + -2);
    uVar14 = (ulong)(iVar16 - 1U);
    if (fVeryVerbose != 0) {
      uVar7 = Vec_IntEntry(vFadds,iVar6);
      uVar8 = Vec_IntEntry(vFadds,i_00);
      uVar9 = Vec_IntEntry(vFadds,iVar17);
      bVar3 = false;
      printf("Recognizing (%d %d) => FA(%d %d %d)\n",(ulong)uVar5,i,(ulong)uVar7,(ulong)uVar8,
             (ulong)uVar9);
      bVar2 = true;
      uVar14 = (ulong)(iVar16 - 1U);
    }
  } while( true );
LAB_0053e663:
  iVar15 = (int)uVar14 * 4 + -3;
  iVar4 = (int)uVar14 * 2 + -1;
  while( true ) {
    iVar17 = (int)uVar14;
    if (iVar17 < 1) {
      uVar13 = (ulong)((int)uVar13 + 1);
      goto LAB_0053e462;
    }
    uVar5 = Vec_IntEntry(vHadds,iVar4 + -1);
    uVar7 = Vec_IntEntry(vHadds,iVar4);
    iVar18 = Vec_IntEntry(pVVar10,uVar5);
    if ((iVar18 != 0) && (iVar18 = Vec_IntEntry(pVVar10,uVar7), iVar18 != 0)) break;
    iVar15 = iVar15 + -4;
    iVar4 = iVar4 + -2;
    uVar14 = (ulong)(iVar17 - 1);
  }
  pGVar11 = Gia_ManObj(pGia,uVar7);
  Vec_IntWriteEntry(pVVar10,uVar5,0);
  Vec_IntWriteEntry(pVVar10,uVar7,0);
  bVar2 = true;
  Vec_IntWriteEntry(pVVar10,uVar7 - (*(uint *)pGVar11 & 0x1fffffff),1);
  Vec_IntWriteEntry(pVVar10,uVar7 - (*(uint *)&pGVar11->field_0x4 & 0x1fffffff),1);
  Vec_IntPush(p,iVar15);
  uVar14 = (ulong)(iVar17 - 1);
  if (fVeryVerbose != 0) {
    printf("Recognizing (%d %d) => HA(%d %d)\n",(ulong)uVar5,(ulong)uVar7,
           (ulong)(uVar7 - ((uint)*(undefined8 *)pGVar11 & 0x1fffffff)));
    bVar2 = true;
  }
  goto LAB_0053e663;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_PolynFindOrder( Gia_Man_t * pGia, Vec_Int_t * vFadds, Vec_Int_t * vHadds, int fVerbose, int fVeryVerbose )
{
    int fDumpLeftOver = 0;
    int i, iXor, iMaj, iAnd, Entry, Iter, fFound, fFoundAll = 1;
    Vec_Int_t * vRecord = Vec_IntAlloc( 100 ), * vLeft, * vRecord2;
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCoDriverId( pGia, iAnd, i )
        Vec_IntWriteEntry( vMap, iAnd, 1 );

    // collect the last XOR
    Vec_IntFreeP( &pGia->vXors );
    pGia->vXors = Gia_PolynCollectLastXor( pGia, fVerbose );
    printf( "Collected %d topmost XORs\n", Vec_IntSize(pGia->vXors) );
    //Vec_IntPrint( p->vXors );
    Vec_IntForEachEntry( pGia->vXors, iAnd, i )
    {
        Gia_Obj_t * pAnd = Gia_ManObj( pGia, iAnd );
        assert( Vec_IntEntry(vMap, iAnd) );
        Vec_IntWriteEntry( vMap, iAnd, 0 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
        Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 3) );
        if ( fVeryVerbose )
            printf( "Recognizing %d => XXXOR(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
    }

    // detect FAs and HAs
    for ( Iter = 0; fFoundAll; Iter++ )
    {
        if ( fVeryVerbose )
            printf( "Iteration %d\n", Iter );

        // check if we can extract FADDs
        fFoundAll = 0;
        do {
            fFound = 0;
            for ( i = Vec_IntSize(vFadds)/5 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vFadds, 5*i+3);
                iMaj = Vec_IntEntry(vFadds, 5*i+4);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+0), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+1), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+2), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 2) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => FA(%d %d %d)\n", iXor, iMaj, Vec_IntEntry(vFadds, 5*i+0), Vec_IntEntry(vFadds, 5*i+1), Vec_IntEntry(vFadds, 5*i+2)  );
                }
            }
        } while ( fFound );
        // check if we can extract HADDs
        do {
            fFound = 0; 
            for ( i = Vec_IntSize(vHadds)/2 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vHadds, 2*i+0);
                iMaj = Vec_IntEntry(vHadds, 2*i+1);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Gia_Obj_t * pAnd = Gia_ManObj( pGia, iMaj );
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iMaj), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iMaj), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 1) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => HA(%d %d)\n", iXor, iMaj, Gia_ObjFaninId0(pAnd, iMaj), Gia_ObjFaninId1(pAnd, iMaj) );
                }
            }
            break; // only one iter!
        } while ( fFound );
        if ( fFoundAll )
            continue;
/*
        // find the last one
        Vec_IntForEachEntryReverse( vMap, Entry, iAnd )
            if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, iAnd)) )//&& Vec_IntFind(vFadds, iAnd) == -1 )//&& Vec_IntFind(vHadds, iAnd) == -1 )
            {
                Gia_Obj_t * pFan0, * pFan1, * pAnd = Gia_ManObj( pGia, iAnd );
                if ( !Gia_ObjRecognizeExor(pAnd, &pFan0, &pFan1) )
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                }
                else
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan0), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan1), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId0(pAnd, iAnd), 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId1(pAnd, iAnd), 0) );
                    printf( "Recognizing %d => XOR(%d %d)\n", iAnd, Gia_ObjId(pGia, pFan0), Gia_ObjId(pGia, pFan1) );
                }
                fFoundAll = 1;
                if ( fVeryVerbose )
                    printf( "Recognizing %d => AND(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
                break;
            }
*/
    }
    //Vec_IntPrint( vMap );

    // collect remaining ones
    vLeft = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vMap, Entry, i )
        if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, i)) )
            Vec_IntPush( vLeft, i );
    Vec_IntFree( vMap );

    // collect them in the topo order
    vRecord2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( pGia );
    Gia_ManCollectAnds( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), vRecord2, NULL );
    Vec_IntForEachEntry( vRecord2, iAnd, i )
        Vec_IntWriteEntry( vRecord2, i, Abc_Var2Lit2(iAnd, 0) );

    // dump remaining nodes as an AIG
    if ( fDumpLeftOver )
    {        
        Gia_Man_t * pNew;
        pNew = Gia_ManDupAndCones( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), 0 );
        Gia_AigerWrite( pNew, "leftover.aig", 0, 0, 0 );
        printf( "Leftover AIG with %d nodes is dumped into file \"%s\".\n", Gia_ManAndNum(pNew), "leftover.aig" );
        Gia_ManStop( pNew );
    }
    Vec_IntFree( vLeft );

    Vec_IntReverseOrder( vRecord );
    Vec_IntAppend( vRecord2, vRecord );
    Vec_IntFree( vRecord );
    return vRecord2;
}